

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O2

void __thiscall
NameProviderTest_ReadNames_Test::NameProviderTest_ReadNames_Test
          (NameProviderTest_ReadNames_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00259708;
  return;
}

Assistant:

TEST(NameProviderTest, ReadNames) {
  std::string filename = GetExecutableDir() + "test";
  WriteFile(filename, "abc\ndef\n");
  mp::NameProvider np(filename, "bar", 5);
  EXPECT_EQ("abc", np.name(0).to_string());
  EXPECT_EQ("def", np.name(1).to_string());
  EXPECT_EQ("bar[3]", np.name(2).to_string());
  EXPECT_EQ("bar[7]", np.name(6).to_string());
}